

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

ModelPackageItemInfo __thiscall
MPL::detail::ModelPackageImpl::createFile
          (ModelPackageImpl *this,string *name,string *author,string *description)

{
  size_type sVar1;
  char cVar2;
  long *plVar3;
  runtime_error *prVar4;
  long *plVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPackageImpl *this_00;
  _Alloc_hider this_01;
  string *in_R8;
  ModelPackageItemInfo MVar6;
  string identifier;
  path dstPath;
  path filePath;
  ofstream stream;
  undefined1 local_2c8 [32];
  string local_2a8;
  path local_288;
  path local_260;
  string *local_238;
  undefined1 local_230 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  ios_base local_138 [264];
  
  this_00 = (ModelPackageImpl *)name;
  local_238 = in_R8;
  findItem((ModelPackageImpl *)local_230,name,author);
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  if (local_230 == (undefined1  [8])0x0) {
    getItemPath(&local_260,this_00,author,description);
    std::filesystem::__cxx11::operator/(&local_288,(path *)&name[2].field_2,&local_260);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories((path *)local_230);
    std::filesystem::__cxx11::path::~path((path *)local_230);
    this_01._M_p = local_288._M_pathname._M_dataplus._M_p;
    std::ofstream::ofstream(local_230,local_288._M_pathname._M_dataplus._M_p,_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      generateIdentifier_abi_cxx11_(&local_2a8,(ModelPackageImpl *)this_01._M_p);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,local_260._M_pathname._M_dataplus._M_p,
                 local_260._M_pathname._M_string_length +
                 (long)local_260._M_pathname._M_dataplus._M_p);
      createItemInfoEntry((ModelPackageImpl *)name,&local_2a8,(string *)local_2c8,author,description
                          ,local_238);
      if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
        operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
      }
      findItem((ModelPackageImpl *)local_2c8,name);
      (this->m_packagePath)._M_pathname._M_dataplus._M_p = *(pointer *)local_2c8._0_8_;
      sVar1 = *(size_type *)(local_2c8._0_8_ + 8);
      (this->m_packagePath)._M_pathname._M_string_length = sVar1;
      if (sVar1 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _strtod;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      std::filesystem::__cxx11::path::~path(&local_288);
      std::filesystem::__cxx11::path::~path(&local_260);
      MVar6.m_modelPackageItemInfoImpl.
      super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      MVar6.m_modelPackageItemInfoImpl.
      super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ModelPackageItemInfo)
             MVar6.m_modelPackageItemInfoImpl.
             super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_2c8._0_8_ = local_2c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,local_288._M_pathname._M_dataplus._M_p,
               local_288._M_pathname._M_string_length + (long)local_288._M_pathname._M_dataplus._M_p
              );
    std::operator+(&local_2a8,"Failed to create file at path: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
    std::runtime_error::runtime_error(prVar4,(string *)&local_2a8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_288._M_pathname,"The package already contains a file with name: ",author);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_260._M_pathname._M_dataplus._M_p = (pointer)*plVar3;
  plVar5 = plVar3 + 2;
  if ((long *)local_260._M_pathname._M_dataplus._M_p == plVar5) {
    local_260._M_pathname.field_2._M_allocated_capacity = *plVar5;
    local_260._M_pathname.field_2._8_8_ = plVar3[3];
    local_260._M_pathname._M_dataplus._M_p = (pointer)&local_260._M_pathname.field_2;
  }
  else {
    local_260._M_pathname.field_2._M_allocated_capacity = *plVar5;
  }
  local_260._M_pathname._M_string_length = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 &local_260._M_pathname,description);
  std::runtime_error::runtime_error(prVar4,(string *)local_230);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ModelPackageItemInfo ModelPackageImpl::createFile(const std::string& name, const std::string& author, const std::string& description) {
    
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
        
    std::ofstream stream(dstPath, std::ios::binary);
    if (!stream.is_open()) {
        throw std::runtime_error("Failed to create file at path: " + dstPath.string());
    }
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return *(findItem(identifier));
}